

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O2

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)

{
  _func_SUNMemoryHelper_SUNMemoryHelper *UNRECOVERED_JUMPTABLE;
  SUNMemoryHelper_Ops p_Var1;
  SUNMemoryHelper_Ops p_Var2;
  _func_int_SUNMemoryHelper_SUNMemory_ptr_size_t_SUNMemoryType_void_ptr *p_Var3;
  _func_int_SUNMemoryHelper_SUNMemory_void_ptr *p_Var4;
  _func_int_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *p_Var5;
  _func_int_SUNMemoryHelper_SUNMemory_SUNMemory_size_t_void_ptr *p_Var6;
  _func_int_SUNMemoryHelper *p_Var7;
  SUNMemoryHelper p_Var8;
  
  UNRECOVERED_JUMPTABLE = helper->ops->clone;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNMemoryHelper_SUNMemoryHelper *)0x0) {
    p_Var8 = (*UNRECOVERED_JUMPTABLE)(helper);
    return p_Var8;
  }
  if ((helper->content != (void *)0x0) ||
     (p_Var8 = SUNMemoryHelper_NewEmpty(helper->sunctx), p_Var8 == (SUNMemoryHelper)0x0)) {
    return (SUNMemoryHelper)0x0;
  }
  p_Var1 = helper->ops;
  if (p_Var1 == (SUNMemoryHelper_Ops)0x0) {
    return p_Var8;
  }
  p_Var2 = p_Var8->ops;
  if (p_Var2 == (SUNMemoryHelper_Ops)0x0) {
    return p_Var8;
  }
  p_Var3 = p_Var1->alloc;
  p_Var4 = p_Var1->dealloc;
  p_Var5 = p_Var1->copy;
  p_Var6 = p_Var1->copyasync;
  p_Var7 = p_Var1->destroy;
  p_Var2->clone = p_Var1->clone;
  p_Var2->destroy = p_Var7;
  p_Var2->copy = p_Var5;
  p_Var2->copyasync = p_Var6;
  p_Var2->alloc = p_Var3;
  p_Var2->dealloc = p_Var4;
  return p_Var8;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)
{
  if (helper->ops->clone == NULL)
  {
    if (helper->content != NULL)
    {
      return(NULL);
    }
    else
    {
      SUNMemoryHelper hclone = SUNMemoryHelper_NewEmpty(helper->sunctx);
      if (hclone) SUNMemoryHelper_CopyOps(helper, hclone);
      return(hclone);
    }
  }
  else
  {
    return(helper->ops->clone(helper));
  }
}